

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTableSetSetTable(BinaryenExpressionRef expr,char *table)

{
  Name local_28;
  
  if (expr->_id != TableSetId) {
    __assert_fail("expression->is<TableSet>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x9e7,"void BinaryenTableSetSetTable(BinaryenExpressionRef, const char *)");
  }
  if (table != (char *)0x0) {
    wasm::Name::Name(&local_28,table);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x9e8,"void BinaryenTableSetSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableSetSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableSet>());
  assert(table);
  static_cast<TableSet*>(expression)->table = table;
}